

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O1

UChar32 utf8IteratorPrevious(UCharIterator *iter)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = iter->reservedField;
  if (uVar2 != 0) {
    iter->reservedField = 0;
    iter->start = iter->start + -4;
    if (0 < iter->index) {
      iter->index = iter->index + -1;
    }
    return (uVar2 >> 10) + 0xd7c0 & 0xffff;
  }
  if (iter->start < 1) {
    return -1;
  }
  uVar2 = iter->start - 1;
  iter->start = uVar2;
  bVar1 = *(byte *)((long)iter->context + (ulong)uVar2);
  uVar2 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar2 = utf8_prevCharSafeBody_63((uint8_t *)iter->context,0,&iter->start,uVar2,-3);
  }
  if (iter->index < 1) {
    iVar3 = iter->start;
    if (1 < iVar3) goto LAB_002b877d;
    iVar3 = iVar3 + (uint)(0xffff < (int)uVar2);
  }
  else {
    iVar3 = iter->index + -1;
  }
  iter->index = iVar3;
LAB_002b877d:
  if (0xffff < (int)uVar2) {
    iter->start = iter->start + 4;
    iter->reservedField = uVar2;
    uVar2 = uVar2 & 0x3ff | 0xdc00;
  }
  return uVar2;
}

Assistant:

static UChar32 U_CALLCONV
utf8IteratorPrevious(UCharIterator *iter) {
    int32_t index;

    if(iter->reservedField!=0) {
        UChar lead=U16_LEAD(iter->reservedField);
        iter->reservedField=0;
        iter->start-=4; /* we stayed behind the supplementary code point; go before it now */
        if((index=iter->index)>0) {
            iter->index=index-1;
        }
        return lead;
    } else if(iter->start>0) {
        const uint8_t *s=(const uint8_t *)iter->context;
        UChar32 c;

        U8_PREV_OR_FFFD(s, 0, iter->start, c);
        if((index=iter->index)>0) {
            iter->index=index-1;
        } else if(iter->start<=1) {
            iter->index= c<=0xffff ? iter->start : iter->start+1;
        }
        if(c<=0xffff) {
            return c;
        } else {
            iter->start+=4; /* back to behind this supplementary code point for consistent state */
            iter->reservedField=c;
            return U16_TRAIL(c);
        }
    } else {
        return U_SENTINEL;
    }
}